

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

void write_elements(ang_file *fff,element_info *el_info)

{
  char *src;
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char buf [1024];
  
  memset(buf,0,0x400);
  iVar3 = 0;
  for (lVar4 = 0; lVar4 != 0xe0; lVar4 = lVar4 + 8) {
    if (el_info->res_level != 100) {
      if (buf[0] != '\0') {
        my_strcat(buf," | ",0x400);
        iVar3 = iVar3 + 3;
      }
      pcVar2 = *(char **)((long)write_elements::element_names + lVar4);
      src = format("RES_%s",pcVar2);
      my_strcat(buf,src,0x400);
      sVar1 = strlen(pcVar2);
      pcVar2 = format("[%d]",(ulong)(100 - (int)el_info->res_level));
      my_strcat(buf,pcVar2,0x400);
      if (iVar3 + (int)sVar1 + 4 < 0x37) {
        iVar3 = iVar3 + (int)sVar1 + 9;
      }
      else {
        iVar3 = 0;
        file_putf(fff,"%s%s\n","values:",buf);
        my_strcpy(buf,"",0x400);
      }
    }
    el_info = el_info + 1;
  }
  if (iVar3 != 0) {
    file_putf(fff,"%s%s\n","values:",buf);
  }
  return;
}

Assistant:

void write_elements(ang_file *fff, const struct element_info *el_info)
{
	size_t i;
	char buf[1024] = "";
	int pointer = 0;

	static const char *element_names[] = {
		#define ELEM(a) #a,
		#include "list-elements.h"
		#undef ELEM
		NULL
	};

	/* Write value list */
	for (i = 0; i < ELEM_MAX; i++) {
		/* If no value, don't write */
		if (el_info[i].res_level == 100) continue;

		/* If this line contains something, write a divider */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* Write the name and value */
		my_strcat(buf, format("RES_%s", element_names[i]), sizeof(buf));
		pointer += strlen(element_names[i]) + 4;
		my_strcat(buf, format("[%d]", RES_LEVEL_BASE - el_info[i].res_level),
				  sizeof(buf));
		pointer += 5;

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", "values:", buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining values if any */
	if (pointer)
		file_putf(fff, "%s%s\n", "values:", buf);
}